

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O3

void gimage::imageToJET<float>
               (ImageU8 *ret,Image<float,_gimage::PixelTraits<float>_> *image,double imin,
               double imax)

{
  float fVar1;
  float **ppfVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  float *pfVar5;
  long lVar6;
  long lVar7;
  long i;
  long lVar8;
  size_t __n;
  uchar uVar9;
  uint uVar10;
  float *pfVar11;
  float *pfVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (ret,image->width,image->height,3);
  auVar4 = _DAT_0014f150;
  if (imax <= imin) {
    lVar8 = image->n;
    lVar6 = -lVar8;
    if (0 < lVar8) {
      lVar6 = lVar8;
    }
    if (lVar8 == 0) {
      imin = 3.4028234663852886e+38;
      imax = -3.4028234663852886e+38;
    }
    else {
      lVar8 = 0;
      fVar13 = 3.4028235e+38;
      do {
        fVar1 = image->pixel[lVar8];
        fVar14 = fVar13;
        if (((uint)ABS(fVar1) < 0x7f800000) && (fVar14 = fVar1, fVar13 <= fVar1)) {
          fVar14 = fVar13;
        }
        lVar8 = lVar8 + 1;
        fVar13 = fVar14;
      } while (lVar6 != lVar8);
      lVar8 = 0;
      fVar13 = -3.4028235e+38;
      do {
        fVar1 = image->pixel[lVar8];
        fVar15 = fVar13;
        if (((uint)ABS(fVar1) < 0x7f800000) && (fVar15 = fVar1, fVar1 <= fVar13)) {
          fVar15 = fVar13;
        }
        lVar8 = lVar8 + 1;
        fVar13 = fVar15;
      } while (lVar6 != lVar8);
      imin = (double)fVar14;
      imax = (double)fVar15;
    }
  }
  if (imax - imin <= 0.0) {
    sVar3 = ret->n;
    __n = -sVar3;
    if (0 < (long)sVar3) {
      __n = sVar3;
    }
    memset(ret->pixel,0,__n);
    return;
  }
  lVar8 = image->height;
  if (0 < lVar8) {
    lVar6 = image->width;
    lVar7 = 0;
    do {
      if (0 < lVar6) {
        lVar8 = 0;
        do {
          pfVar11 = (float *)(long)image->depth;
          ppfVar2 = *image->img;
          if ((long)pfVar11 < 1) {
            pfVar11 = ppfVar2[lVar7];
            fVar13 = pfVar11[lVar8];
LAB_0012d894:
            dVar16 = (((double)fVar13 - imin) / (imax - imin)) / 1.15 + 0.1;
            dVar19 = ABS(dVar16 + -0.75) * -4.0 + 1.5;
            if (1.0 <= dVar19) {
              dVar19 = 1.0;
            }
            auVar17._0_8_ = ABS(dVar16 + -0.25) * -4.0 + 1.5;
            auVar17._8_8_ = ABS(dVar16 + -0.5) * -4.0 + 1.5;
            auVar18 = minpd(auVar17,auVar4);
            dVar16 = auVar18._0_8_;
            dVar20 = auVar18._8_8_;
            auVar18._8_4_ = (int)-(ulong)(0.0 < dVar20);
            auVar18._0_8_ = -(ulong)(0.0 < dVar16);
            auVar18._12_4_ = (int)(-(ulong)(0.0 < dVar20) >> 0x20);
            uVar10 = movmskpd((int)pfVar11,auVar18);
            if ((uVar10 & 2) == 0) {
              dVar20 = 0.0;
            }
            if ((uVar10 & 1) == 0) {
              dVar16 = 0.0;
            }
            if (dVar19 <= 0.0) {
              dVar19 = 0.0;
            }
            (*ret->img)[lVar7][lVar8] = (uchar)(int)(dVar19 * 255.0 + 0.5);
            ret->img[1][lVar7][lVar8] = (uchar)(int)(dVar20 * 255.0 + 0.5);
            uVar9 = (uchar)(int)(dVar16 * 255.0 + 0.5);
          }
          else {
            fVar13 = ppfVar2[lVar7][lVar8];
            if ((uint)ABS(fVar13) < 0x7f800000) {
              pfVar5 = (float *)0x1;
              do {
                pfVar12 = pfVar5;
                if (pfVar11 == pfVar12) break;
                pfVar5 = (float *)((long)pfVar12 + 1);
              } while ((uint)ABS(image->img[(long)pfVar12][lVar7][lVar8]) < 0x7f800000);
              if (pfVar11 <= pfVar12) goto LAB_0012d894;
            }
            uVar9 = '\0';
            (*ret->img)[lVar7][lVar8] = '\0';
            ret->img[1][lVar7][lVar8] = '\0';
          }
          ret->img[2][lVar7][lVar8] = uVar9;
          lVar8 = lVar8 + 1;
          lVar6 = image->width;
        } while (lVar8 < lVar6);
        lVar8 = image->height;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < lVar8);
  }
  return;
}

Assistant:

void imageToJET(ImageU8 &ret, const Image<T> &image, double imin=0, double imax=-1)
{
  ret.setSize(image.getWidth(), image.getHeight(), 3);

  if (imax <= imin)
  {
    imin=image.minValue();
    imax=image.maxValue();
  }

  double irange=imax-imin;

  if (irange <= 0)
  {
    ret.clear();
    return;
  }

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      if (image.isValid(i, k))
      {
        double v=image.get(i, k, 0);

        v=(v-imin)/irange;
        v=v/1.15+0.1;

        double r=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.75))));
        double g=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.5))));
        double b=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.25))));

        ret.set(i, k, 0, static_cast<unsigned char>(255*r+0.5));
        ret.set(i, k, 1, static_cast<unsigned char>(255*g+0.5));
        ret.set(i, k, 2, static_cast<unsigned char>(255*b+0.5));
      }
      else
      {
        ret.set(i, k, 0, 0);
        ret.set(i, k, 1, 0);
        ret.set(i, k, 2, 0);
      }
    }
  }
}